

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

Parsekey __thiscall
free_format_parser::HMpsFF::parseCones(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  string *str;
  bool bVar1;
  Parsekey PVar2;
  size_t sVar3;
  Parsekey PVar4;
  vector<double,_std::allocator<double>_> *this_00;
  HMpsFF *this_01;
  ConeType conetype;
  bool skip;
  HighsLogOptions *local_138;
  HighsInt colidx;
  string conetypestr;
  string colname;
  size_t local_e0;
  string strline;
  string coneparam;
  string conename;
  size_t begin;
  string thirdarg;
  string secondarg;
  
  str = &this->section_args;
  local_138 = log_options;
  first_word(&conename,str,0);
  sVar3 = first_word_end(str,0);
  if (conename._M_string_length == 0) {
    highsLogUser(local_138,kError,"Cone name missing in CSECTION\n");
    PVar4 = kFail;
    goto LAB_002267e2;
  }
  first_word(&secondarg,str,sVar3);
  sVar3 = first_word_end(str,sVar3);
  first_word(&thirdarg,str,sVar3);
  local_e0 = first_word_end(str,sVar3);
  std::__cxx11::string::string((string *)&coneparam,"0.0",(allocator *)&conetypestr);
  conetypestr._M_dataplus._M_p = (pointer)&conetypestr.field_2;
  conetypestr._M_string_length = 0;
  conetypestr.field_2._M_local_buf[0] = '\0';
  if (thirdarg._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&coneparam);
  }
  std::__cxx11::string::_M_assign((string *)&conetypestr);
  if (conetypestr._M_string_length == 0) {
    trim(str,&default_non_chars_abi_cxx11_);
    highsLogUser(local_138,kError,"Cone type missing in CSECTION %s\n",(str->_M_dataplus)._M_p);
LAB_0022657f:
    PVar4 = kFail;
  }
  else {
    bVar1 = std::operator==(&conetypestr,"ZERO");
    if (bVar1) {
      conetype = kZero;
    }
    else {
      bVar1 = std::operator==(&conetypestr,"QUAD");
      if (bVar1) {
        conetype = kQuad;
      }
      else {
        bVar1 = std::operator==(&conetypestr,"RQUAD");
        if (bVar1) {
          conetype = kRQuad;
        }
        else {
          bVar1 = std::operator==(&conetypestr,"PEXP");
          if (bVar1) {
            conetype = kPExp;
          }
          else {
            bVar1 = std::operator==(&conetypestr,"PPOW");
            if (bVar1) {
              conetype = kPPow;
            }
            else {
              bVar1 = std::operator==(&conetypestr,"DEXP");
              if (bVar1) {
                conetype = kDExp;
              }
              else {
                bVar1 = std::operator==(&conetypestr,"DPOW");
                if (!bVar1) {
                  trim(&conetypestr,&default_non_chars_abi_cxx11_);
                  highsLogUser(local_138,kError,"Unrecognized cone type %s\n",
                               conetypestr._M_dataplus._M_p);
                  goto LAB_0022657f;
                }
                conetype = kDPow;
              }
            }
          }
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->cone_name,&conename);
    std::
    vector<free_format_parser::HMpsFF::ConeType,_std::allocator<free_format_parser::HMpsFF::ConeType>_>
    ::push_back(&this->cone_type,&conetype);
    this_00 = &this->cone_param;
    strline._M_dataplus._M_p = (pointer)atof(coneparam._M_dataplus._M_p);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&strline);
    strline._M_dataplus._M_p = (pointer)0x0;
    strline._M_string_length = 0;
    strline.field_2._M_allocated_capacity = 0;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&this->cone_entries,(vector<int,_std::allocator<int>_> *)&strline);
    this_01 = (HMpsFF *)&strline;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&strline);
    strline._M_dataplus._M_p = (pointer)&strline.field_2;
    strline._M_string_length = 0;
    strline.field_2._M_allocated_capacity =
         strline.field_2._M_allocated_capacity & 0xffffffffffffff00;
    do {
      do {
        bVar1 = getMpsLine(this_01,file,&strline,&skip);
        if (!bVar1) {
          PVar4 = kFail;
          goto LAB_002267a7;
        }
      } while (skip != false);
      bVar1 = timeout(this);
      if (bVar1) {
        PVar4 = kTimeout;
        break;
      }
      colname._M_string_length = 0;
      colname.field_2._M_local_buf[0] = '\0';
      colname._M_dataplus._M_p = (pointer)&colname.field_2;
      PVar2 = checkFirstWord(this,&strline,&begin,&local_e0,&colname);
      if (PVar2 == kNone) {
        colidx = getColIdx(this,&colname,true);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((this->cone_entries).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1,&colidx);
      }
      else {
        highsLogDev(local_138,kInfo,"readMPS: Read CSECTION OK\n");
        this_00 = (vector<double,_std::allocator<double>_> *)(ulong)PVar2;
      }
      PVar4 = (Parsekey)this_00;
      this_01 = (HMpsFF *)&colname;
      std::__cxx11::string::~string((string *)this_01);
    } while (PVar2 == kNone);
LAB_002267a7:
    std::__cxx11::string::~string((string *)&strline);
  }
  std::__cxx11::string::~string((string *)&conetypestr);
  std::__cxx11::string::~string((string *)&coneparam);
  std::__cxx11::string::~string((string *)&thirdarg);
  std::__cxx11::string::~string((string *)&secondarg);
LAB_002267e2:
  std::__cxx11::string::~string((string *)&conename);
  return PVar4;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseCones(const HighsLogOptions& log_options,
                                             std::istream& file) {
  size_t end = 0;

  // first argument should be cone name
  std::string conename = first_word(section_args, end);
  end = first_word_end(section_args, end);

  if (conename.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "Cone name missing in CSECTION\n");
    return HMpsFF::Parsekey::kFail;
  }

  // second argument is cone parameter, but is optional
  // third argument is cone type
  std::string secondarg = first_word(section_args, end);
  end = first_word_end(section_args, end);

  std::string thirdarg = first_word(section_args, end);
  end = first_word_end(section_args, end);

  std::string coneparam = "0.0";
  std::string conetypestr;
  if (thirdarg.empty()) {
    conetypestr = secondarg;
  } else {
    coneparam = secondarg;
    conetypestr = thirdarg;
  }

  if (conetypestr.empty()) {
    trim(section_args);
    highsLogUser(log_options, HighsLogType::kError,
                 "Cone type missing in CSECTION %s\n", section_args.c_str());
    return HMpsFF::Parsekey::kFail;
  }

  ConeType conetype;
  if (conetypestr == "ZERO")
    conetype = ConeType::kZero;
  else if (conetypestr == "QUAD")
    conetype = ConeType::kQuad;
  else if (conetypestr == "RQUAD")
    conetype = ConeType::kRQuad;
  else if (conetypestr == "PEXP")
    conetype = ConeType::kPExp;
  else if (conetypestr == "PPOW")
    conetype = ConeType::kPPow;
  else if (conetypestr == "DEXP")
    conetype = ConeType::kDExp;
  else if (conetypestr == "DPOW")
    conetype = ConeType::kDPow;
  else {
    trim(conetypestr);
    highsLogUser(log_options, HighsLogType::kError,
                 "Unrecognized cone type %s\n", conetypestr.c_str());
    return HMpsFF::Parsekey::kFail;
  }

  cone_name.push_back(conename);
  cone_type.push_back(conetype);
  cone_param.push_back(atof(coneparam.c_str()));
  cone_entries.push_back(std::vector<HighsInt>());

  // now parse the cone entries: one column per line
  std::string strline;
  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin;
    std::string colname;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, colname);

    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read CSECTION OK\n");
      return key;
    }

    // colname -> colidx
    HighsInt colidx = getColIdx(colname);
    assert(colidx >= 0);
    assert(colidx < num_col);

    cone_entries.back().push_back(colidx);
  }

  return HMpsFF::Parsekey::kFail;
}